

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SpecifyWithLengthCase::iterate
          (SpecifyWithLengthCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  undefined8 uVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  MessageBuilder local_1a48;
  allocator<char> local_18c1;
  string local_18c0;
  string local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  GetNameFunc local_1860;
  int local_1858;
  GetNameFunc local_1850;
  int local_1848;
  string local_1840;
  allocator<char> local_1819;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17b8;
  int local_1794;
  undefined1 local_1790 [4];
  deUint32 err_7;
  GetNameFunc local_1610;
  int local_1608;
  GetNameFunc local_1600;
  int local_15f8;
  string local_15f0;
  allocator<char> local_15c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1568;
  int local_1544;
  undefined1 local_1540 [4];
  deUint32 err_6;
  allocator<char> local_13b9;
  string local_13b8;
  allocator<char> local_1391;
  string local_1390;
  ScopedLogSection local_1370;
  ScopedLogSection section_2;
  string local_1360;
  MessageBuilder local_1340;
  MessageBuilder local_11c0;
  string local_1040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  GetNameFunc local_1000;
  int local_ff8;
  GetNameFunc local_ff0;
  int local_fe8;
  string local_fe0;
  allocator<char> local_fb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  int local_f34;
  undefined1 local_f30 [4];
  deUint32 err_5;
  GetNameFunc local_db0;
  int local_da8;
  GetNameFunc local_da0;
  int local_d98;
  string local_d90;
  allocator<char> local_d69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  int local_ce4;
  undefined1 local_ce0 [4];
  deUint32 err_4;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  ScopedLogSection local_b10;
  ScopedLogSection section_1;
  string local_b00;
  MessageBuilder local_ae0;
  MessageBuilder local_960;
  string local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  GetNameFunc local_7a0;
  int local_798;
  GetNameFunc local_790;
  int local_788;
  string local_780;
  allocator<char> local_759;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  int local_6d4;
  undefined1 local_6d0 [4];
  deUint32 err_3;
  GetNameFunc local_550;
  int local_548;
  GetNameFunc local_540;
  int local_538;
  string local_530;
  allocator<char> local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  int local_484;
  undefined1 local_480 [4];
  deUint32 err_2;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  ScopedLogSection local_2b0;
  ScopedLogSection section;
  TestLog *local_298;
  int local_290;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  GetNameFunc p_Stack_1d8;
  deUint32 err_1;
  int local_1d0;
  GetNameFunc local_1c8;
  int local_1c0;
  string local_1b8;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  char local_108 [4];
  deUint32 err;
  char buffer [64];
  GLsync sync;
  GLuint shader;
  int outlen;
  char *clipMsg;
  char *msg;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  Functions *gl;
  SpecifyWithLengthCase *this_local;
  
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_TestCase).m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," // ERROR: ",(allocator<char> *)((long)&msg + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msg + 7));
      clipMsg = "This is a debug label";
      _shader = "This is a de";
      sync._4_4_ = -1;
      uVar6 = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_10c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_10c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"Got Error ",&local_191);
          EVar8 = glu::getErrorStr(local_10c);
          p_Stack_1d8 = EVar8.m_getName;
          local_1d0 = EVar8.m_value;
          local_1c8 = p_Stack_1d8;
          local_1c0 = local_1d0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b8,&local_1c8);
          std::operator+(&local_170,&local_190,&local_1b8);
          std::operator+(&local_150,&local_170,": ");
          std::operator+(&local_130,&local_150,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      sync._0_4_ = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_1dc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1dc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,"Got Error ",&local_261);
          EVar8 = glu::getErrorStr(local_1dc);
          section.m_log = (TestLog *)EVar8.m_getName;
          local_290 = EVar8.m_value;
          local_298 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_298);
          std::operator+(&local_240,&local_260,&local_288);
          std::operator+(&local_220,&local_240,": ");
          std::operator+(&local_200,&local_220,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Shader",&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"Shader object",&local_2f9);
      tcu::ScopedLogSection::ScopedLogSection(&local_2b0,pTVar5,&local_2d0,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_480,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_480,(char (*) [27])"Setting label to string: \"");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&clipMsg);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"\" with length 12");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_480);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                (0x82e1,sync._0_4_,0xc,"This is a debug label");
      do {
        local_484 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_484 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_508,"Got Error ",&local_509);
          EVar8 = glu::getErrorStr(local_484);
          local_550 = EVar8.m_getName;
          local_548 = EVar8.m_value;
          local_540 = local_550;
          local_538 = local_548;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_530,&local_540);
          std::operator+(&local_4e8,&local_508,&local_530);
          std::operator+(&local_4c8,&local_4e8,": ");
          std::operator+(&local_4a8,&local_4c8,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_530);
          std::__cxx11::string::~string((string *)&local_508);
          std::allocator<char>::~allocator(&local_509);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_6d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_6d0,(char (*) [15])"Querying label");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6d0);
      ::deMemset(local_108,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                (0x82e1,sync._0_4_,0x40,(long)&sync + 4,local_108);
      do {
        local_6d4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_6d4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_758,"Got Error ",&local_759);
          EVar8 = glu::getErrorStr(local_6d4);
          local_7a0 = EVar8.m_getName;
          local_798 = EVar8.m_value;
          local_790 = local_7a0;
          local_788 = local_798;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_780,&local_790);
          std::operator+(&local_738,&local_758,&local_780);
          std::operator+(&local_718,&local_738,": ");
          std::operator+(&local_6f8,&local_718,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_738);
          std::__cxx11::string::~string((string *)&local_780);
          std::__cxx11::string::~string((string *)&local_758);
          std::allocator<char>::~allocator(&local_759);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0xc) {
        dVar2 = deStringEqual("This is a de",local_108);
        if (dVar2 == 0) {
          buffer[0x37] = '\0';
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_ae0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_ae0,(char (*) [40])"Query returned wrong string: expected \"");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&shader);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"\" but got \"");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [64])local_108);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b3d55e);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_ae0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b00,"Query returned wrong label",
                     (allocator<char> *)((long)&section_1.m_log + 7));
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_b00);
          std::__cxx11::string::~string((string *)&local_b00);
          std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
        }
        else {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_960,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_960,(char (*) [25])"Query returned string: \"");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [64])local_108);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b3d55e);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_960);
        }
      }
      else {
        de::toString<int>(&local_7e0,(int *)((long)&sync + 4));
        std::operator+(&local_7c0,"\'length\' was not 12, got ",&local_7e0);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_7e0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2b0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"Sync",&local_b31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b58,"Sync object",&local_b59);
      tcu::ScopedLogSection::ScopedLogSection(&local_b10,pTVar5,&local_b30,&local_b58);
      std::__cxx11::string::~string((string *)&local_b58);
      std::allocator<char>::~allocator(&local_b59);
      std::__cxx11::string::~string((string *)&local_b30);
      std::allocator<char>::~allocator(&local_b31);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_ce0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_ce0,(char (*) [27])"Setting label to string: \"");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&clipMsg);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"\" with length 12");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_ce0);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc8))(uVar6,0xc,"This is a debug label");
      do {
        local_ce4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_ce4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d68,"Got Error ",&local_d69);
          EVar8 = glu::getErrorStr(local_ce4);
          local_db0 = EVar8.m_getName;
          local_da8 = EVar8.m_value;
          local_da0 = local_db0;
          local_d98 = local_da8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d90,&local_da0);
          std::operator+(&local_d48,&local_d68,&local_d90);
          std::operator+(&local_d28,&local_d48,": ");
          std::operator+(&local_d08,&local_d28,"objectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_d08);
          std::__cxx11::string::~string((string *)&local_d08);
          std::__cxx11::string::~string((string *)&local_d28);
          std::__cxx11::string::~string((string *)&local_d48);
          std::__cxx11::string::~string((string *)&local_d90);
          std::__cxx11::string::~string((string *)&local_d68);
          std::allocator<char>::~allocator(&local_d69);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_f30,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_f30,(char (*) [15])"Querying label");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_f30);
      ::deMemset(local_108,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))(uVar6,0x40,(long)&sync + 4,local_108);
      do {
        local_f34 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_f34 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fb8,"Got Error ",&local_fb9);
          EVar8 = glu::getErrorStr(local_f34);
          local_1000 = EVar8.m_getName;
          local_ff8 = EVar8.m_value;
          local_ff0 = local_1000;
          local_fe8 = local_ff8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_fe0,&local_ff0);
          std::operator+(&local_f98,&local_fb8,&local_fe0);
          std::operator+(&local_f78,&local_f98,": ");
          std::operator+(&local_f58,&local_f78,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_f58);
          std::__cxx11::string::~string((string *)&local_f58);
          std::__cxx11::string::~string((string *)&local_f78);
          std::__cxx11::string::~string((string *)&local_f98);
          std::__cxx11::string::~string((string *)&local_fe0);
          std::__cxx11::string::~string((string *)&local_fb8);
          std::allocator<char>::~allocator(&local_fb9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0xc) {
        dVar2 = deStringEqual("This is a de",local_108);
        if (dVar2 == 0) {
          buffer[0x37] = '\0';
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1340,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_1340,(char (*) [40])"Query returned wrong string: expected \"")
          ;
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&shader);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"\" but got \"");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [64])local_108);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b3d55e);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1340);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1360,"Query returned wrong label",
                     (allocator<char> *)((long)&section_2.m_log + 7));
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1360);
          std::__cxx11::string::~string((string *)&local_1360);
          std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
        }
        else {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_11c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_11c0,(char (*) [25])"Query returned string: \"");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [64])local_108);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b3d55e);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_11c0);
        }
      }
      else {
        de::toString<int>(&local_1040,(int *)((long)&sync + 4));
        std::operator+(&local_1020,"\'length\' was not 12, got ",&local_1040);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1020);
        std::__cxx11::string::~string((string *)&local_1020);
        std::__cxx11::string::~string((string *)&local_1040);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_b10);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1390,"ZeroSized",&local_1391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13b8,"ZeroSized",&local_13b9);
      tcu::ScopedLogSection::ScopedLogSection(&local_1370,pTVar5,&local_1390,&local_13b8);
      std::__cxx11::string::~string((string *)&local_13b8);
      std::allocator<char>::~allocator(&local_13b9);
      std::__cxx11::string::~string((string *)&local_1390);
      std::allocator<char>::~allocator(&local_1391);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1540,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1540,(char (*) [27])"Setting label to string: \"")
      ;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&clipMsg);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])"\" with length 0");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1540);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                (0x82e1,sync._0_4_,0,"This is a debug label");
      do {
        local_1544 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1544 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15c8,"Got Error ",&local_15c9);
          EVar8 = glu::getErrorStr(local_1544);
          local_1610 = EVar8.m_getName;
          local_1608 = EVar8.m_value;
          local_1600 = local_1610;
          local_15f8 = local_1608;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_15f0,&local_1600);
          std::operator+(&local_15a8,&local_15c8,&local_15f0);
          std::operator+(&local_1588,&local_15a8,": ");
          std::operator+(&local_1568,&local_1588,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1568);
          std::__cxx11::string::~string((string *)&local_1568);
          std::__cxx11::string::~string((string *)&local_1588);
          std::__cxx11::string::~string((string *)&local_15a8);
          std::__cxx11::string::~string((string *)&local_15f0);
          std::__cxx11::string::~string((string *)&local_15c8);
          std::allocator<char>::~allocator(&local_15c9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1790,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1790,(char (*) [15])"Querying label");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1790);
      ::deMemset(local_108,0x58,0x40);
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                (0x82e1,sync._0_4_,0x40,(long)&sync + 4,local_108);
      do {
        local_1794 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1794 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1818,"Got Error ",&local_1819);
          EVar8 = glu::getErrorStr(local_1794);
          local_1860 = EVar8.m_getName;
          local_1858 = EVar8.m_value;
          local_1850 = local_1860;
          local_1848 = local_1858;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1840,&local_1850);
          std::operator+(&local_17f8,&local_1818,&local_1840);
          std::operator+(&local_17d8,&local_17f8,": ");
          std::operator+(&local_17b8,&local_17d8,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_17b8);
          std::__cxx11::string::~string((string *)&local_17b8);
          std::__cxx11::string::~string((string *)&local_17d8);
          std::__cxx11::string::~string((string *)&local_17f8);
          std::__cxx11::string::~string((string *)&local_1840);
          std::__cxx11::string::~string((string *)&local_1818);
          std::allocator<char>::~allocator(&local_1819);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0) {
        if (local_108[0] == '\0') {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1a48,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_1a48,(char (*) [36])"Got 0-sized null-terminated string.");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1a48);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_18c0,"label was not null terminated",&local_18c1);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_18c0);
          std::__cxx11::string::~string((string *)&local_18c0);
          std::allocator<char>::~allocator(&local_18c1);
        }
      }
      else {
        de::toString<int>(&local_18a0,(int *)((long)&sync + 4));
        std::operator+(&local_1880,"\'length\' was not zero, got ",&local_18a0);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1880);
        std::__cxx11::string::~string((string *)&local_1880);
        std::__cxx11::string::~string((string *)&local_18a0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1370);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(sync._0_4_);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(uVar6);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x806);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

SpecifyWithLengthCase::IterateResult SpecifyWithLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	const char*	const		clipMsg		= "This is a de";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ZeroSized", "ZeroSized");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 0" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 0, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}